

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_object_t * gravity_object_deserialize(gravity_vm *vm,json_value *entry)

{
  _json_value *p_Var1;
  int iVar2;
  gravity_object_t *pgVar3;
  gravity_range_t *range;
  gravity_map_t *m_1;
  gravity_class_t *c;
  gravity_function_t *f;
  gravity_map_t *m;
  json_value *value;
  char *label;
  json_value *entry_local;
  gravity_vm *vm_local;
  
  if (entry->type == json_object) {
    if ((entry->u).boolean == 0) {
      vm_local = (gravity_vm *)0x0;
    }
    else {
      p_Var1 = ((entry->u).object.values)->value;
      iVar2 = string_casencmp(((entry->u).object.values)->name,"type",4);
      if (iVar2 == 0) {
        if (p_Var1->type == json_string) {
          iVar2 = string_casencmp((p_Var1->u).string.ptr,"function",(ulong)(p_Var1->u).string.length
                                 );
          if (iVar2 == 0) {
            vm_local = (gravity_vm *)gravity_function_deserialize(vm,entry);
          }
          else {
            iVar2 = string_casencmp((p_Var1->u).string.ptr,"class",(ulong)(p_Var1->u).string.length)
            ;
            if (iVar2 == 0) {
              vm_local = (gravity_vm *)gravity_class_deserialize(vm,entry);
            }
            else {
              iVar2 = string_casencmp((p_Var1->u).string.ptr,"map",(ulong)(p_Var1->u).string.length)
              ;
              if ((iVar2 != 0) &&
                 (iVar2 = string_casencmp((p_Var1->u).string.ptr,"enum",
                                          (ulong)(p_Var1->u).string.length), iVar2 != 0)) {
                iVar2 = string_casencmp((p_Var1->u).string.ptr,"range",
                                        (ulong)(p_Var1->u).string.length);
                if (iVar2 == 0) {
                  pgVar3 = (gravity_object_t *)gravity_range_deserialize(vm,entry);
                  return pgVar3;
                }
                return (gravity_object_t *)0x0;
              }
              vm_local = (gravity_vm *)gravity_map_deserialize(vm,entry);
            }
          }
        }
        else {
          vm_local = (gravity_vm *)0x0;
        }
      }
      else {
        vm_local = (gravity_vm *)gravity_map_deserialize(vm,entry);
      }
    }
  }
  else {
    vm_local = (gravity_vm *)0x0;
  }
  return (gravity_object_t *)vm_local;
}

Assistant:

gravity_object_t *gravity_object_deserialize (gravity_vm *vm, json_value *entry) {
    // this function is able to deserialize ONLY objects with a type label
    
    // sanity check
    if (entry->type != json_object) return NULL;
    if (entry->u.object.length == 0) return NULL;

    // the first entry value must specify gravity object type
    const char *label = entry->u.object.values[0].name;
    json_value *value = entry->u.object.values[0].value;
    
    if (string_casencmp(label, GRAVITY_JSON_LABELTYPE, 4) != 0) {
        // if no label type found then assume it is a map object
        gravity_map_t *m = gravity_map_deserialize(vm, entry);
        return (gravity_object_t *)m;
    }
    
    // sanity check
    if (value->type != json_string) return NULL;

    // FUNCTION case
    if (string_casencmp(value->u.string.ptr, GRAVITY_JSON_FUNCTION, value->u.string.length) == 0) {
        gravity_function_t *f = gravity_function_deserialize(vm, entry);
        return (gravity_object_t *)f;
    }

    // CLASS case
    if (string_casencmp(value->u.string.ptr, GRAVITY_JSON_CLASS, value->u.string.length) == 0) {
        gravity_class_t *c = gravity_class_deserialize(vm, entry);
        return (gravity_object_t *)c;
    }

    // MAP/ENUM case
    if ((string_casencmp(value->u.string.ptr, GRAVITY_JSON_MAP, value->u.string.length) == 0) ||
        (string_casencmp(value->u.string.ptr, GRAVITY_JSON_ENUM, value->u.string.length) == 0)) {
        gravity_map_t *m = gravity_map_deserialize(vm, entry);
        return (gravity_object_t *)m;
    }
    
    // RANGE case
    if (string_casencmp(value->u.string.ptr, GRAVITY_JSON_RANGE, value->u.string.length) == 0) {
        gravity_range_t *range = gravity_range_deserialize(vm, entry);
        return (gravity_object_t *)range;
    }

    // unhandled case
    DEBUG_DESERIALIZE("gravity_object_deserialize unknown type");
    return NULL;
}